

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexpander.cpp
# Opt level: O0

void __thiscall PathExpander::addToPathlist(PathExpander *this,char *s)

{
  FString local_20;
  FString copy;
  char *s_local;
  PathExpander *this_local;
  
  copy.Chars = s;
  FString::FString(&local_20,s);
  FixPathSeperator(&local_20);
  TArray<FString,_FString>::Push(&this->PathList,&local_20);
  FString::~FString(&local_20);
  return;
}

Assistant:

void PathExpander::addToPathlist(const char *s)
{
	FString copy = s;
	FixPathSeperator(copy);
	PathList.Push(copy);
}